

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O1

void __thiscall
ADPlanner::PrintSearchPath(ADPlanner *this,ADSearchStateSpace_t *pSearchStateSpace,FILE *fOut)

{
  DiscreteSpaceInformation *pDVar1;
  void *pvVar2;
  CMDPSTATE *pCVar3;
  uint uVar4;
  bool bVar5;
  
  pCVar3 = pSearchStateSpace->searchgoalstate;
  if (fOut == (FILE *)0x0) {
    fOut = _stdout;
  }
  pDVar1 = (this->super_SBPLPlanner).environment_;
  (*pDVar1->_vptr_DiscreteSpaceInformation[0x12])(pDVar1,(ulong)(uint)pCVar3->StateID,1,fOut);
  if (pCVar3->StateID != pSearchStateSpace->searchstartstate->StateID) {
    uVar4 = 0;
    while (((pvVar2 = pCVar3->PlannerSpecificData, pvVar2 != (void *)0x0 &&
            (pCVar3 = *(CMDPSTATE **)((long)pvVar2 + (ulong)(this->bforwardsearch ^ 1) * 8 + 0x30),
            pCVar3 != (CMDPSTATE *)0x0)) && (*(int *)((long)pvVar2 + 0x24) != 1000000000))) {
      pDVar1 = (this->super_SBPLPlanner).environment_;
      (*pDVar1->_vptr_DiscreteSpaceInformation[0x12])(pDVar1,(ulong)(uint)pCVar3->StateID,1,fOut);
      if (pCVar3->StateID == pSearchStateSpace->searchstartstate->StateID) {
        return;
      }
      bVar5 = 0x1869e < uVar4;
      uVar4 = uVar4 + 1;
      if (bVar5) {
        return;
      }
    }
  }
  return;
}

Assistant:

void ADPlanner::PrintSearchPath(ADSearchStateSpace_t* pSearchStateSpace, FILE* fOut)
{
    ADState* searchstateinfo;
    CMDPSTATE* state = pSearchStateSpace->searchgoalstate;
    CMDPSTATE* nextstate = NULL;

    if (fOut == NULL) fOut = stdout;

    int PathCost = ((ADState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g;

    SBPL_FPRINTF(fOut, "Printing a path from state %d to the search start state %d\n", state->StateID,
                 pSearchStateSpace->searchstartstate->StateID);
    SBPL_FPRINTF(fOut, "Path cost = %d:\n", PathCost);

    environment_->PrintState(state->StateID, true, fOut);

    int costFromStart = 0;
    int steps = 0;
    const int max_steps = 100000;
    while (state->StateID != pSearchStateSpace->searchstartstate->StateID && steps < max_steps) {
        steps++;

        SBPL_FPRINTF(fOut, "state %d ", state->StateID);

        if (state->PlannerSpecificData == NULL) {
            SBPL_FPRINTF(fOut, "path does not exist since search data does not exist\n");
            break;
        }

        searchstateinfo = (ADState*)state->PlannerSpecificData;

        if (bforwardsearch)
            nextstate = searchstateinfo->bestpredstate;
        else
            nextstate = searchstateinfo->bestnextstate;

        if (nextstate == NULL) {
            SBPL_FPRINTF(fOut, "path does not exist since nextstate == NULL\n");
            break;
        }
        if (searchstateinfo->g == INFINITECOST) {
            SBPL_FPRINTF(fOut, "path does not exist since state->g == NULL\n");
            break;
        }

        int costToGoal = PathCost - costFromStart;
        if (!bforwardsearch) {
            //otherwise this cost is not even set
            costFromStart += searchstateinfo->costtobestnextstate;
        }

#if DEBUG
        if (searchstateinfo->g > searchstateinfo->v) {
            std::stringstream ss; ss << "ERROR: underconsistent state " << state->StateID << " is encountered";
            SBPL_FPRINTF(fOut, "%s\n", ss.str().c_str());
            throw SBPL_Exception(ss.str());
        }

        if (!bforwardsearch) { //otherwise this cost is not even set
            if(nextstate->PlannerSpecificData != NULL && searchstateinfo->g < searchstateinfo->costtobestnextstate + ((ADState*)(nextstate->PlannerSpecificData))->g)
            {
                const char* msg = "ERROR: g(source) < c(source,target) + g(target)";
                SBPL_FPRINTF(fOut, "%s\n", msg);
                throw SBPL_Exception(msg);
            }
        }
#endif

        //PrintSearchState(searchstateinfo, fOut);
        SBPL_FPRINTF(fOut, "-->state %d ctg = %d  ", nextstate->StateID, costToGoal);

        state = nextstate;

        environment_->PrintState(state->StateID, true, fOut);
    }

    if (state->StateID != pSearchStateSpace->searchstartstate->StateID) {
        SBPL_ERROR("ERROR: Failed to printsearchpath, max_steps reached\n");
        return;
    }
}